

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2b41b::file_output::file_output
          (file_output *this,path *dir,processed_file *f,bool write)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  file_entry *pfVar5;
  exception *this_00;
  byte in_CL;
  processed_item<setup::file_entry> *in_RDX;
  undefined8 uVar6;
  char *in_RDI;
  openmode flags;
  undefined4 in_stack_fffffffffffffef8;
  _Ios_Fmtflags in_stack_fffffffffffffefc;
  path *in_stack_ffffffffffffff00;
  checksum_type in_stack_ffffffffffffff0c;
  hasher *in_stack_ffffffffffffff10;
  path *in_stack_ffffffffffffff20;
  path *in_stack_ffffffffffffff28;
  
  (anonymous_namespace)::processed_item<setup::file_entry>::path_abi_cxx11_
            ((processed_item<setup::file_entry> *)in_RDX);
  std::_Construct<std::__cxx11::string,std::__cxx11::string_const&>
            (in_stack_ffffffffffffff00,
             (path *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  boost::filesystem::operator/(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::_Destroy<std::__cxx11::string>((path *)0x123c7e);
  *(processed_item<setup::file_entry> **)(in_RDI + 0x20) = in_RDX;
  boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream
            ((basic_fstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff10);
  processed_item<setup::file_entry>::entry(in_RDX);
  crypto::hasher::hasher(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  pcVar4 = in_RDI + 0x2a8;
  pfVar5 = processed_item<setup::file_entry>::entry(in_RDX);
  uVar6 = 0;
  if ((pfVar5->checksum).type == None) {
    uVar6 = 0xffffffffffffffff;
  }
  *(undefined8 *)pcVar4 = uVar6;
  in_RDI[0x2b0] = '\0';
  in_RDI[0x2b1] = '\0';
  in_RDI[0x2b2] = '\0';
  in_RDI[0x2b3] = '\0';
  in_RDI[0x2b4] = '\0';
  in_RDI[0x2b5] = '\0';
  in_RDI[0x2b6] = '\0';
  in_RDI[0x2b7] = '\0';
  in_RDI[0x2b8] = '\0';
  in_RDI[0x2b9] = '\0';
  in_RDI[0x2ba] = '\0';
  in_RDI[699] = '\0';
  in_RDI[700] = '\0';
  in_RDI[0x2bd] = '\0';
  in_RDI[0x2be] = '\0';
  in_RDI[0x2bf] = '\0';
  in_RDI[0x2c0] = in_CL & 1;
  if ((in_RDI[0x2c0] & 1U) != 0) {
    _Var3 = std::operator|(_S_out,_S_bin);
    _Var3 = std::operator|(_Var3,_S_trunc);
    bVar1 = processed_file::is_multipart((processed_file *)0x123d8b);
    if (bVar1) {
      std::operator|=((_Ios_Fmtflags *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    }
    boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::open
              ((basic_fstream<char,_std::char_traits<char>_> *)(in_RDI + 0x28),in_RDI,_Var3);
    bVar2 = std::fstream::is_open();
    if ((bVar2 & 1) == 0) {
      this_00 = (exception *)__cxa_allocate_exception(8);
      std::exception::exception(this_00);
      __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
    }
  }
  return;
}

Assistant:

explicit file_output(const fs::path & dir, const processed_file * f, bool write)
		: path_(dir / f->path())
		, file_(f)
		, checksum_(f->entry().checksum.type)
		, checksum_position_(f->entry().checksum.type == crypto::None ? boost::uint64_t(-1) : 0)
		, position_(0)
		, total_written_(0)
		, write_(write)
	{
		if(write_) {
			try {
				std::ios_base::openmode flags = std::ios_base::out | std::ios_base::binary | std::ios_base::trunc;
				if(file_->is_multipart()) {
					flags |= std::ios_base::in;
				}
				stream_.open(path_, flags);
				if(!stream_.is_open()) {
					throw std::exception();
				}
			} catch(...) {
				throw std::runtime_error("Could not open output file \"" + path_.string() + '"');
			}
		}
	}